

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LocalSingleStoreElimPass::LocalSingleStoreElim
          (LocalSingleStoreElimPass *this,Function *func)

{
  bool bVar1;
  Op OVar2;
  Instruction *this_00;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  BasicBlock *__range2;
  reference local_28;
  BasicBlock *entry_block;
  IRContext *pIStack_18;
  bool modified;
  Function *func_local;
  LocalSingleStoreElimPass *this_local;
  
  entry_block._7_1_ = 0;
  pIStack_18 = (IRContext *)func;
  func_local = (Function *)this;
  ___range2 = Function::begin(func);
  local_28 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                       ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__range2);
  BasicBlock::begin((BasicBlock *)&__end2);
  BasicBlock::end((BasicBlock *)&inst);
  while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&inst), bVar1) {
    this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    OVar2 = Instruction::opcode(this_00);
    if (OVar2 != OpVariable) break;
    bVar1 = ProcessVariable(this,this_00);
    entry_block._7_1_ = (entry_block._7_1_ & 1) != 0 || bVar1;
    InstructionList::iterator::operator++(&__end2);
  }
  return (bool)(entry_block._7_1_ & 1);
}

Assistant:

bool LocalSingleStoreElimPass::LocalSingleStoreElim(Function* func) {
  bool modified = false;

  // Check all function scope variables in |func|.
  BasicBlock* entry_block = &*func->begin();
  for (Instruction& inst : *entry_block) {
    if (inst.opcode() != spv::Op::OpVariable) {
      break;
    }

    modified |= ProcessVariable(&inst);
  }
  return modified;
}